

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O3

void __thiscall re2::SparseSet::SparseSet(SparseSet *this,int max_size)

{
  int *piVar1;
  bool bVar2;
  int *piVar3;
  int i;
  ulong uVar4;
  
  this->max_size_ = max_size;
  uVar4 = 0xffffffffffffffff;
  if (-1 < max_size) {
    uVar4 = (ulong)(uint)max_size * 4;
  }
  piVar3 = (int *)operator_new__(uVar4);
  this->sparse_to_dense_ = piVar3;
  piVar3 = (int *)operator_new__(uVar4);
  this->dense_ = piVar3;
  bVar2 = RunningOnValgrind();
  if (bVar2 && 0 < max_size) {
    piVar3 = this->sparse_to_dense_;
    piVar1 = this->dense_;
    uVar4 = 0;
    do {
      piVar1[uVar4] = -0x54545455;
      piVar3[uVar4] = -0x54545455;
      uVar4 = uVar4 + 1;
    } while ((uint)max_size != uVar4);
  }
  this->size_ = 0;
  return;
}

Assistant:

SparseSet(int max_size) {
    max_size_ = max_size;
    sparse_to_dense_ = new int[max_size];
    dense_ = new int[max_size];
    // Don't need to zero the memory, but do so anyway
    // to appease Valgrind.
    if (InitMemory()) {
      for (int i = 0; i < max_size; i++) {
        dense_[i] = 0xababababU;
        sparse_to_dense_[i] = 0xababababU;
      }
    }
    size_ = 0;
  }